

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase411::run(TestCase411 *this)

{
  undefined8 uVar1;
  ArrayDisposer *pAVar2;
  AsyncIoStream *pAVar3;
  void *pvVar4;
  Disposer *pDVar5;
  long *plVar6;
  RemoveConst<void_*> *ppvVar7;
  Connection CVar8;
  undefined8 *__n;
  void *__buf;
  int in_R8D;
  bool bVar9;
  Client CVar10;
  PipeThread serverThread;
  TestBootstrapFactory bootstrapFactory;
  AsyncIoContext ioContext;
  Response<capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdResults>
  resp;
  TwoPartyClient client;
  undefined1 local_2f8 [24];
  undefined8 *local_2e0;
  ArrayDisposer *pAStack_2d8;
  undefined8 *local_2d0;
  void *local_2c8;
  undefined8 *local_2c0;
  AsyncIoStream *local_2b8;
  undefined1 local_2b0 [32];
  void *local_290;
  Disposer *pDStack_288;
  RequestHook *local_280;
  undefined **local_278;
  char local_270;
  undefined8 *local_268;
  long *local_260;
  undefined8 *local_258;
  long *local_250;
  Promise<capnp::Response<capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdResults>_>
  local_238;
  void *local_220;
  short local_214;
  undefined1 local_210 [16];
  RemoveConst<void_*> *local_200;
  Side_9fd69ebc87b9719c local_1f8;
  undefined6 uStack_1f6;
  ArrayDisposer *pAStack_1f0;
  undefined1 local_1e8 [48];
  Disposer *local_1b8;
  Maybe<capnp::MessageSize> local_1b0;
  TwoPartyClient local_198;
  
  kj::setupAsyncIo();
  plVar6 = local_250;
  local_278 = &PTR_baseCreateFor_00610f78;
  local_270 = '\0';
  local_198.network.super_Connection.super_Connection._vptr_Connection =
       (Connection)operator_new(0x10);
  *(undefined ***)local_198.network.super_Connection.super_Connection._vptr_Connection =
       &PTR_operator___00611048;
  *(undefined ****)((long)local_198.network.super_Connection.super_Connection._vptr_Connection + 8)
       = &local_278;
  __n = &kj::_::
         HeapDisposer<kj::Function<void(kj::AsyncIoProvider&,kj::AsyncIoStream&,kj::WaitScope&)>::Impl<capnp::_::(anonymous_namespace)::runAuthenticatingServer(kj::AsyncIoProvider&,capnp::BootstrapFactory<capnp::rpc::twoparty::VatId>&)::$_0>>
         ::instance;
  local_198.network.super_TwoPartyVatNetworkBase.super_VatNetworkBase._vptr_VatNetworkBase =
       (VatNetworkBase)
       &kj::_::
        HeapDisposer<kj::Function<void(kj::AsyncIoProvider&,kj::AsyncIoStream&,kj::WaitScope&)>::Impl<capnp::_::(anonymous_namespace)::runAuthenticatingServer(kj::AsyncIoProvider&,capnp::BootstrapFactory<capnp::rpc::twoparty::VatId>&)::$_0>>
        ::instance;
  (**(code **)(*plVar6 + 0x20))(&local_2d0,plVar6);
  CVar8.super_Connection._vptr_Connection =
       local_198.network.super_Connection.super_Connection._vptr_Connection;
  if (local_198.network.super_Connection.super_Connection._vptr_Connection != (_func_int **)0x0) {
    local_198.network.super_Connection.super_Connection._vptr_Connection =
         (Connection)(_func_int **)0x0;
    (**(code **)*(_func_int **)
                 local_198.network.super_TwoPartyVatNetworkBase.super_VatNetworkBase.
                 _vptr_VatNetworkBase)
              (local_198.network.super_TwoPartyVatNetworkBase.super_VatNetworkBase.
               _vptr_VatNetworkBase,
               (long)CVar8.super_Connection._vptr_Connection +
               *(long *)(*(long *)CVar8.super_Connection._vptr_Connection + -0x10));
  }
  TwoPartyClient::TwoPartyClient(&local_198,local_2b8);
  CVar10 = TwoPartyClient::bootstrap((TwoPartyClient *)local_2f8);
  (**(code **)(*(_func_int **)local_2f8._8_8_ + 0x20))(&local_1f8,local_2f8._8_8_,CVar10.hook.ptr);
  local_2e0 = (undefined8 *)CONCAT62(uStack_1f6,local_1f8);
  pAStack_2d8 = pAStack_1f0;
  local_2f8._16_8_ =
       &capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::Client
        ::typeinfo;
  local_1b0.ptr.isSet = false;
  capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::Client::
  getCallerIdRequest((Request<capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdParams,_capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdResults>
                      *)local_1e8,(Client *)(local_2f8 + 0x10),&local_1b0);
  Request<capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdParams,_capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdResults>
  ::send((Request<capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdParams,_capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdResults>
          *)local_2b0,(int)local_1e8,__buf,(size_t)__n,in_R8D);
  kj::
  Promise<capnp::Response<capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdResults>_>
  ::wait(&local_238,local_2b0);
  pDVar5 = pDStack_288;
  pvVar4 = local_290;
  if (local_290 != (void *)0x0) {
    local_290 = (void *)0x0;
    pDStack_288 = (Disposer *)0x0;
    (**local_280->_vptr_RequestHook)(local_280,pvVar4,8,pDVar5,pDVar5,0);
  }
  uVar1 = local_2b0._24_8_;
  if ((WirePointer *)local_2b0._24_8_ != (WirePointer *)0x0) {
    local_2b0._24_8_ = (WirePointer *)0x0;
    (*(code *)**(undefined8 **)local_2b0._16_8_)
              (local_2b0._16_8_,
               (long)&((WireValue<uint32_t>_conflict *)uVar1)->value +
               *(long *)((long)*(WirePointer *)uVar1 + -0x10));
  }
  uVar1 = local_2b0._8_8_;
  if ((CapTableReader *)local_2b0._8_8_ != (CapTableReader *)0x0) {
    local_2b0._8_8_ = (CapTableReader *)0x0;
    (*(code *)((SegmentReader *)local_2b0._0_8_)->arena->_vptr_Arena)
              (local_2b0._0_8_,
               ((CapTableReader *)uVar1)->_vptr_CapTableReader[-2] +
               (long)&((CapTableReader *)uVar1)->_vptr_CapTableReader);
  }
  pDVar5 = local_1b8;
  if (local_1b8 != (Disposer *)0x0) {
    local_1b8 = (Disposer *)0x0;
    (***(_func_int ***)local_1e8._40_8_)
              (local_1e8._40_8_,pDVar5->_vptr_Disposer[-2] + (long)&pDVar5->_vptr_Disposer);
  }
  pAVar2 = pAStack_2d8;
  if (pAStack_2d8 != (ArrayDisposer *)0x0) {
    pAStack_2d8 = (ArrayDisposer *)0x0;
    (**(code **)*local_2e0)
              (local_2e0,pAVar2->_vptr_ArrayDisposer[-2] + (long)&pAVar2->_vptr_ArrayDisposer);
  }
  uVar1 = local_2f8._8_8_;
  if ((_func_int **)local_2f8._8_8_ != (_func_int **)0x0) {
    local_2f8._8_8_ = (_func_int **)0x0;
    (**(code **)*(_func_int **)local_2f8._0_8_)
              (local_2f8._0_8_,uVar1 + *(long *)(*(_func_int **)uVar1 + -0x10));
  }
  bVar9 = local_214 == 0;
  local_1e8._16_8_ = local_220;
  if (bVar9) {
    local_1e8._16_8_ = (WirePointer *)0x0;
  }
  local_1e8._24_4_ = 0x7fffffff;
  if (!bVar9) {
    local_1e8._24_4_ = local_210._0_4_;
  }
  local_1e8._0_4_ = 0;
  local_1e8._4_4_ = 0;
  local_1e8._8_4_ = 0;
  local_1e8._12_4_ = 0;
  if (!bVar9) {
    local_1e8._0_4_ = local_238.super_PromiseBase.node.disposer._0_4_;
    local_1e8._4_4_ = local_238.super_PromiseBase.node.disposer._4_4_;
    local_1e8._8_4_ = (int)local_238.super_PromiseBase.node.ptr;
    local_1e8._12_4_ = local_238.super_PromiseBase.node.ptr._4_4_;
  }
  PointerReader::getStruct((StructReader *)local_2b0,(PointerReader *)local_1e8,(word *)0x0);
  if ((uint)local_290 < 0x10) {
    if (2 < kj::_::Debug::minSeverity) goto LAB_0031201d;
LAB_00311f43:
    local_2f8._16_2_ = 1;
    bVar9 = local_214 == 0;
    local_1e8._16_8_ = local_220;
    if (bVar9) {
      local_1e8._16_8_ = (WirePointer *)0x0;
    }
    local_1e8._24_4_ = 0x7fffffff;
    if (!bVar9) {
      local_1e8._24_4_ = local_210._0_4_;
    }
    local_1e8._0_4_ = 0;
    local_1e8._4_4_ = 0;
    local_1e8._8_4_ = 0;
    local_1e8._12_4_ = 0;
    if (!bVar9) {
      local_1e8._0_4_ = local_238.super_PromiseBase.node.disposer._0_4_;
      local_1e8._4_4_ = local_238.super_PromiseBase.node.disposer._4_4_;
      local_1e8._8_4_ = (int)local_238.super_PromiseBase.node.ptr;
      local_1e8._12_4_ = local_238.super_PromiseBase.node.ptr._4_4_;
    }
    PointerReader::getStruct((StructReader *)local_2b0,(PointerReader *)local_1e8,(word *)0x0);
    if ((uint)local_290 < 0x10) {
      local_1f8 = SERVER;
    }
    else {
      local_1f8 = *(Side_9fd69ebc87b9719c *)local_2b0._16_8_;
    }
    kj::_::Debug::
    log<char_const(&)[79],capnp::schemas::Side_9fd69ebc87b9719c,capnp::schemas::Side_9fd69ebc87b9719c>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0x1a2,ERROR,
               "\"failed: expected \" \"(rpc::twoparty::Side::CLIENT) == (resp.getCaller().getSide())\", rpc::twoparty::Side::CLIENT, resp.getCaller().getSide()"
               ,(char (*) [79])
                "failed: expected (rpc::twoparty::Side::CLIENT) == (resp.getCaller().getSide())",
               (Side_9fd69ebc87b9719c *)(local_2f8 + 0x10),&local_1f8);
  }
  else if (*(Side_9fd69ebc87b9719c *)local_2b0._16_8_ != CLIENT && kj::_::Debug::minSeverity < 3)
  goto LAB_00311f43;
  if ((local_270 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0x1a3,ERROR,"\"failed: expected \" \"bootstrapFactory.called\"",
               (char (*) [41])"failed: expected bootstrapFactory.called");
  }
LAB_0031201d:
  ppvVar7 = local_200;
  if (local_200 != (RemoveConst<void_*> *)0x0) {
    local_200 = (RemoveConst<void_*> *)0x0;
    (*(code *)**(undefined8 **)local_210._8_8_)
              (local_210._8_8_,(long)ppvVar7 + *(long *)((long)*ppvVar7 + -0x10));
  }
  RpcSystemBase::~RpcSystemBase(&local_198.rpcSystem.super_RpcSystemBase);
  TwoPartyVatNetwork::~TwoPartyVatNetwork(&local_198.network);
  pAVar3 = local_2b8;
  if (local_2b8 != (AsyncIoStream *)0x0) {
    local_2b8 = (AsyncIoStream *)0x0;
    (**(code **)*local_2c0)
              (local_2c0,
               (pAVar3->super_AsyncInputStream)._vptr_AsyncInputStream[-2] +
               (long)&(pAVar3->super_AsyncInputStream)._vptr_AsyncInputStream);
  }
  if (local_2c8 != (void *)0x0) {
    local_2c8 = (void *)0x0;
    (**(code **)*local_2d0)();
  }
  plVar6 = local_250;
  if (local_250 != (long *)0x0) {
    local_250 = (long *)0x0;
    (**(code **)*local_258)(local_258,(long)plVar6 + *(long *)(*plVar6 + -0x10));
  }
  plVar6 = local_260;
  if (local_260 != (long *)0x0) {
    local_260 = (long *)0x0;
    (**(code **)*local_268)(local_268,(long)plVar6 + *(long *)(*plVar6 + -0x10));
  }
  return;
}

Assistant:

TEST(TwoPartyNetwork, BootstrapFactory) {
  auto ioContext = kj::setupAsyncIo();
  TestBootstrapFactory bootstrapFactory;
  auto serverThread = runAuthenticatingServer(*ioContext.provider, bootstrapFactory);
  TwoPartyClient client(*serverThread.pipe);
  auto resp = client.bootstrap().castAs<test::TestAuthenticatedBootstrap<rpc::twoparty::VatId>>()
      .getCallerIdRequest().send().wait(ioContext.waitScope);
  EXPECT_EQ(rpc::twoparty::Side::CLIENT, resp.getCaller().getSide());
  EXPECT_TRUE(bootstrapFactory.called);
}